

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_const_context_t_conflict p_Var3;
  exr_coding_channel_info_t *peVar4;
  bool bVar5;
  exr_result_t eVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  char cVar12;
  uint64_t dataoffset;
  exr_result_t local_50;
  uint64_t local_38;
  
  p_Var3 = decode->context;
  if (p_Var3 == (exr_const_context_t_conflict)0x0) {
    eVar6 = 2;
  }
  else {
    if (p_Var3->mode != '\0') {
      eVar6 = (*p_Var3->standard_error)(p_Var3,7);
      return eVar6;
    }
    uVar1 = decode->part_index;
    if (((int)uVar1 < 0) || (p_Var3->num_parts <= (int)uVar1)) {
      eVar6 = (*p_Var3->print_error)
                        (p_Var3,4,"Part index (%d) out of range",(ulong)uVar1,p_Var3->print_error);
      return eVar6;
    }
    local_38 = (decode->chunk).data_offset;
    uVar7 = (ulong)(decode->chunk).height;
    if (0 < (long)uVar7) {
      iVar2 = (decode->chunk).start_y;
      uVar11 = 0;
      do {
        bVar5 = 0 < decode->channel_count;
        if (0 < decode->channel_count) {
          lVar10 = 0x28;
          lVar9 = 0;
          do {
            peVar4 = decode->channels;
            cVar12 = '\a';
            if (*(int *)((long)peVar4 + lVar10 + -0x20) != 0) {
              uVar1 = *(uint *)((long)peVar4 + lVar10 + -0x14);
              if ((int)uVar1 < 2) {
                lVar8 = (long)*(int *)((long)peVar4 + lVar10 + -4) * uVar11;
              }
              else {
                if ((iVar2 + (int)uVar11) % (int)uVar1 != 0) goto LAB_0012f172;
                lVar8 = (long)*(int *)((long)peVar4 + lVar10 + -4) *
                        ((uVar11 & 0xffffffff) / (ulong)uVar1);
              }
              eVar6 = (*p_Var3->do_read)(p_Var3,(void *)(*(long *)((long)&peVar4->channel_name +
                                                                  lVar10) + lVar8),
                                         (long)*(char *)((long)peVar4 + lVar10 + -0xf) *
                                         (long)*(int *)((long)peVar4 + lVar10 + -0x1c),&local_38,
                                         (int64_t *)0x0,EXR_MUST_READ_ALL);
              cVar12 = eVar6 != 0;
              if ((bool)cVar12) {
                local_50 = eVar6;
              }
            }
LAB_0012f172:
            if ((cVar12 != '\a') && (cVar12 != '\0')) break;
            lVar9 = lVar9 + 1;
            lVar10 = lVar10 + 0x30;
            bVar5 = lVar9 < decode->channel_count;
          } while (lVar9 < decode->channel_count);
        }
        if (bVar5) {
          return local_50;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar7);
    }
    eVar6 = 0;
  }
  return eVar6;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t        rv;
    int                 height, start_y;
    uint64_t            dataoffset, toread;
    uint8_t*            cdata;
    exr_const_context_t ctxt = decode->context;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (ctxt->mode != EXR_CONTEXT_READ)
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_READ);
    if (decode->part_index < 0 || decode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else { cdata += (uint64_t) y * (uint64_t) decc->user_line_stride; }

            /* actual read into the output pointer */
            rv = ctxt->do_read (
                ctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}